

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall nivalis::ParseSession::end_thunk(ParseSession *this)

{
  _OpCode *__args;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *this_00;
  
  this_00 = in_RDI + 1;
  __args = (_OpCode *)
           std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                     (in_RDI + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
  emplace_back<nivalis::OpCode::_OpCode,unsigned_long>(in_RDI,__args,(unsigned_long *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x114645);
  return;
}

Assistant:

void end_thunk() {
        result.ast.emplace_back(OpCode::thunk_jmp,
                    result.ast.size() - thunks.back());
        thunks.pop_back();
    }